

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

int Bmc_FxCompute(Gia_Man_t *p)

{
  sat_solver *pSat_00;
  int iVar1;
  int iOut;
  int iVar2;
  Vec_Int_t *p_00;
  int iVar3;
  char *pcVar4;
  Vec_Int_t *vVars;
  int nCubes [2] [2];
  int local_48;
  int iAuxVarStart;
  int nCounter;
  int RetValue;
  int n;
  int i;
  int o;
  int iCiVarBeg;
  int nCiVars;
  int nOuts;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *p2;
  Gia_Man_t *p_local;
  
  p2 = p;
  pCnf = (Cnf_Dat_t *)Gia_ManDupOnsetOffset(p);
  pSat = (sat_solver *)Mf_ManGenerateCnf((Gia_Man_t *)pCnf,8,0,0,0);
  _nCiVars = (sat_solver *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pSat,1,0);
  iCiVarBeg = Gia_ManCoNum(p2);
  o = Gia_ManCiNum(p2);
  i = pSat->qhead - o;
  iVar1 = sat_solver_nvars(_nCiVars);
  memset(&vVars,0,0x10);
  p_00 = Vec_IntAlloc(o);
  for (nCounter = 0; nCounter < o; nCounter = nCounter + 1) {
    Vec_IntPush(p_00,i + nCounter);
  }
  sat_solver_setnvars(_nCiVars,iVar1 + iCiVarBeg * 4);
  for (n = 0; n < iCiVarBeg; n = n + 1) {
    for (RetValue = 0; RetValue < 2; RetValue = RetValue + 1) {
      for (nCounter = 0; nCounter < 2; nCounter = nCounter + 1) {
        pcVar4 = " on";
        if (nCounter != 0) {
          pcVar4 = "off";
        }
        printf("Out %3d %sset ",(ulong)(uint)n,pcVar4);
        pSat_00 = _nCiVars;
        iOut = Abc_Var2Lit(n,nCounter);
        iVar3 = RetValue * 2 * iCiVarBeg;
        iVar2 = Abc_Var2Lit(n,nCounter);
        iAuxVarStart = Bmc_FxSolve(pSat_00,iOut,iVar1 + iVar3 + iVar2,p_00,0,0,&local_48,
                                   (Vec_Wec_t *)0x0);
        if (iAuxVarStart == 0) {
          printf("Mismatch\n");
        }
        if (iAuxVarStart == -1) {
          printf("Timeout\n");
        }
        nCubes[(long)RetValue + -1][nCounter] = local_48 + nCubes[(long)RetValue + -1][nCounter];
      }
    }
  }
  Vec_IntFree(p_00);
  sat_solver_delete(_nCiVars);
  Cnf_DataFree((Cnf_Dat_t *)pSat);
  Gia_ManStop((Gia_Man_t *)pCnf);
  printf("Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n",(ulong)(uint)vVars,
         (ulong)vVars._4_4_,(ulong)(uint)nCubes[0][0],(ulong)(uint)nCubes[0][1]);
  return 1;
}

Assistant:

int Bmc_FxCompute( Gia_Man_t * p )
{
    // create dual-output circuit with on-set/off-set
    extern Gia_Man_t * Gia_ManDupOnsetOffset( Gia_Man_t * p );
    Gia_Man_t * p2 = Gia_ManDupOnsetOffset( p );
    // create SAT solver
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p2, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    // compute parameters
    int nOuts = Gia_ManCoNum(p);
    int nCiVars = Gia_ManCiNum(p), iCiVarBeg = pCnf->nVars - nCiVars;// - 1;
    int o, i, n, RetValue, nCounter, iAuxVarStart = sat_solver_nvars( pSat );
    int nCubes[2][2] = {{0}};
    // create variables
    Vec_Int_t * vVars = Vec_IntAlloc( nCiVars );
    for ( n = 0; n < nCiVars; n++ )
        Vec_IntPush( vVars, iCiVarBeg + n );
    sat_solver_setnvars( pSat, iAuxVarStart + 4*nOuts );
    // iterate through outputs
    for ( o = 0; o < nOuts; o++ )
    for ( i = 0; i < 2; i++ )
    for ( n = 0; n < 2; n++ ) // 0=onset, 1=offset
//    for ( n = 1; n >= 0; n-- ) // 0=onset, 1=offset
    {
        printf( "Out %3d %sset ", o, n ? "off" : " on" );
        RetValue = Bmc_FxSolve( pSat, Abc_Var2Lit(o, n), iAuxVarStart + 2*i*nOuts + Abc_Var2Lit(o, n), vVars, 0, 0, &nCounter, NULL );
        if ( RetValue == 0 )
            printf( "Mismatch\n" );
        if ( RetValue == -1 )
            printf( "Timeout\n" );
        nCubes[i][n] += nCounter;
    }
    // cleanup
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( p2 );
    printf( "Onset = %5d.   Offset = %5d.      Onset = %5d.   Offset = %5d.\n", nCubes[0][0], nCubes[0][1], nCubes[1][0], nCubes[1][1] );
    return 1;
}